

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O1

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,PreOrPostIncOrDec *p)

{
  int iVar1;
  char **in_R9;
  Type type;
  undefined8 local_a0;
  Structure *local_90;
  char *local_88;
  CompileMessage local_80;
  CompileMessage local_48;
  
  (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,(p->target).object);
  iVar1 = (*(((p->target).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xf])();
  if ((char)iVar1 == '\0') {
    local_a0 = "--";
    if (p->isIncrement != false) {
      local_a0 = "++";
    }
    CompileMessageHelpers::createMessage<char_const*>
              (&local_48,(CompileMessageHelpers *)0x1,none,0x2aca29,(char *)&local_a0,in_R9);
    AST::Context::throwError
              (&(p->super_Expression).super_Statement.super_ASTObject.context,&local_48,false);
  }
  (*(((p->target).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_a0);
  if ((local_a0._4_4_ != 9) && (((byte)local_a0 - 4 < 2 || ((byte)local_a0 == 1)))) {
    RefCountedPtr<soul::Structure>::decIfNotNull(local_90);
    return;
  }
  local_88 = "--";
  if (p->isIncrement != false) {
    local_88 = "++";
  }
  CompileMessageHelpers::createMessage<char_const*>
            (&local_80,(CompileMessageHelpers *)0x1,none,0x2ad6dc,(char *)&local_88,in_R9);
  AST::Context::throwError
            (&(p->super_Expression).super_Statement.super_ASTObject.context,&local_80,false);
}

Assistant:

void visit (AST::PreOrPostIncOrDec& p) override
        {
            super::visit (p);

            auto getOperatorName = [] (const AST::PreOrPostIncOrDec& pp)  { return pp.isIncrement ? "++" : "--"; };

            if (! p.target->isAssignable())
                p.context.throwError (Errors::operatorNeedsAssignableTarget (getOperatorName (p)));

            auto type = p.target->getResultType();

            if (type.isBool() || ! (type.isPrimitive() || type.isBoundedInt()))
                p.context.throwError (Errors::illegalTypeForOperator (getOperatorName (p)));
        }